

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::forward_int8_x86
          (ConvolutionDepthWise_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  int *piVar3;
  _func_int **pp_Var4;
  void *pvVar5;
  void *pvVar6;
  Layer *pLVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined4 uVar34;
  undefined1 uVar35;
  undefined1 uVar37;
  undefined1 uVar39;
  undefined1 uVar41;
  long lVar42;
  undefined8 uVar43;
  Option OVar44;
  undefined1 auVar45 [36];
  int iVar46;
  long lVar47;
  undefined1 uVar48;
  uint uVar49;
  int iVar50;
  Allocator *pAVar51;
  ulong uVar52;
  long lVar53;
  int iVar54;
  int iVar55;
  float *pfVar56;
  uint _elempack;
  ulong uVar57;
  ulong uVar58;
  uint uVar59;
  int iVar60;
  int iVar61;
  _func_int *p_Var62;
  float fVar63;
  int iVar64;
  Option *_elemsize;
  Option *opt_00;
  long lVar65;
  int iVar66;
  int iVar67;
  undefined1 (*pauVar68) [16];
  undefined1 (*pauVar69) [16];
  ulong uVar70;
  bool bVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [64];
  float fVar113;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  v4sf one;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar147;
  undefined1 auVar146 [64];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  Option opt_q;
  float top_rescale;
  float scale_out;
  Mat m_1;
  Option opt_g;
  undefined1 local_2f8 [24];
  uint uStack_2e0;
  Allocator *pAStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  uint uStack_2c0;
  undefined1 auStack_2dc [36];
  size_t local_2b8;
  float *local_2b0;
  float *local_2a8;
  _func_int ***local_2a0;
  ulong local_298;
  ulong local_290;
  Mat local_288;
  Mat local_238;
  long local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  _func_int **local_1d0;
  pointer local_1c8;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  int local_1b0;
  Allocator *local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined4 local_190;
  ulong local_188;
  void *local_178;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 local_168;
  undefined4 uStack_164;
  int local_160;
  Allocator *local_158;
  undefined8 local_150;
  undefined8 uStack_148;
  int local_140;
  ulong local_138;
  Mat local_128;
  long local_e0;
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined4 uVar36;
  undefined3 uVar38;
  undefined2 uVar40;
  undefined1 auVar90 [16];
  
  local_128.elempack = bottom_blob->elempack;
  local_128.c = bottom_blob->c;
  if (local_128.elempack == 0) {
    bVar71 = false;
  }
  else {
    bVar71 = ((int)bottom_blob->elemsize << 3) / local_128.elempack == 8;
  }
  p_Var62 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
  iVar55 = *(int *)(&this->field_0xd4 + (long)p_Var62);
  iVar66 = *(int *)(&this->field_0xd8 + (long)p_Var62);
  iVar60 = *(int *)(&this->field_0xdc + (long)p_Var62);
  iVar67 = *(int *)(&this->field_0xe0 + (long)p_Var62);
  piVar3 = bottom_blob->refcount;
  local_128.data = bottom_blob->data;
  local_128.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_128.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_128.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
  local_128.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_128.allocator = bottom_blob->allocator;
  local_128.dims = bottom_blob->dims;
  local_128.w = bottom_blob->w;
  local_128.h = bottom_blob->h;
  local_128.d = bottom_blob->d;
  local_128.cstep = bottom_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (!bVar71) {
    uVar57 = (long)(local_128.elempack * local_128.c) /
             (long)*(int *)(&this->field_0x108 +
                           (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]);
    local_288.cstep = 0;
    local_288.data = (Allocator *)0x0;
    local_288.refcount._0_4_ = 0;
    local_288.refcount._4_4_ = 0;
    local_288.elemsize._0_4_ = 0;
    local_288.elempack = 0;
    local_288.elemsize._4_4_ = (int)local_288.refcount;
    local_288.allocator = (Allocator *)local_288.data;
    local_288.dims = (int)local_288.refcount;
    local_288.w = local_288.refcount._4_4_;
    local_288.h = (int)local_288.elemsize;
    local_288.d = (int)local_288.refcount;
    local_288.c = local_288.elempack;
    Mat::create(&local_288,local_128.elempack * local_128.c,4,(Allocator *)0x0);
    pp_Var4 = this->_vptr_ConvolutionDepthWise_x86_avx512;
    p_Var62 = pp_Var4[-3];
    if (0 < *(int *)(&this->field_0x108 + (long)p_Var62)) {
      lVar53 = 0;
      pAVar51 = (Allocator *)local_288.data;
      do {
        if (0 < (int)uVar57) {
          uVar1 = *(undefined4 *)(*(long *)(&this->field_0x240 + (long)p_Var62) + lVar53 * 4);
          uVar58 = uVar57 & 0xffffffff;
          do {
            *(undefined4 *)&pAVar51->_vptr_Allocator = uVar1;
            pAVar51 = (Allocator *)((long)&pAVar51->_vptr_Allocator + 4);
            uVar59 = (int)uVar58 - 1;
            uVar58 = (ulong)uVar59;
          } while (uVar59 != 0);
        }
        lVar53 = lVar53 + 1;
        p_Var62 = pp_Var4[-3];
      } while (lVar53 < *(int *)(&this->field_0x108 + (long)p_Var62));
    }
    stack0xfffffffffffffd18 = SUB6448(*opt,0x10);
    local_2f8._0_8_ = SUB648(*opt,0);
    local_2f8._8_8_ = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_128,&local_288,(Option *)local_2f8);
    piVar3 = (int *)CONCAT44(local_288.refcount._4_4_,(int)local_288.refcount);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_288.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_288.data != (Allocator *)0x0) {
            free(local_288.data);
          }
        }
        else {
          (*(local_288.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  local_288.cstep = 0;
  local_288.data = (Allocator *)0x0;
  local_288.refcount._0_4_ = 0;
  local_288.refcount._4_4_ = 0;
  local_288.elemsize._0_4_ = 0;
  local_288.elempack = 0;
  local_288.elemsize._4_4_ = (int)local_288.refcount;
  local_288.allocator = (Allocator *)local_288.data;
  local_288.dims = (int)local_288.refcount;
  local_288.w = local_288.refcount._4_4_;
  local_288.h = (int)local_288.elemsize;
  local_288.d = (int)local_288.refcount;
  local_288.c = local_288.elempack;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_avx512 +
             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]),&local_128,&local_288,opt);
  iVar50 = local_288.c;
  iVar46 = local_288.w;
  iVar54 = local_288.elempack;
  iVar61 = -100;
  if (((Allocator *)local_288.data == (Allocator *)0x0) ||
     ((long)local_288.c * local_288.cstep == 0)) goto LAB_004434b3;
  uVar58 = (ulong)(uint)local_288.c;
  p_Var62 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
  iVar55 = (~((iVar55 + -1) * iVar60) + local_288.w) / *(int *)(&this->field_0xe4 + (long)p_Var62);
  iVar60 = iVar55 + 1;
  uVar57 = (long)(~((iVar66 + -1) * iVar67) + local_288.h) /
           (long)*(int *)(&this->field_0xe8 + (long)p_Var62);
  local_1d8 = uVar57 & 0xffffffff;
  iVar66 = (int)uVar57 + 1;
  uVar59 = local_288.c * local_288.elempack;
  if ((uVar59 == *(uint *)(&this->field_0x108 + (long)p_Var62)) &&
     (uVar49 = *(uint *)(&this->field_0xd0 + (long)p_Var62),
     *(uint *)(&this->field_0x108 + (long)p_Var62) == uVar49)) {
    uVar59 = 8;
    if (opt->use_packing_layout == false) {
      uVar59 = 1;
    }
    if ((uVar49 & 7) != 0) {
      uVar59 = 1;
    }
    opt_00 = (Option *)(ulong)uVar59;
    iVar67 = *(int *)(&this->field_0x10c + (long)p_Var62);
    _elemsize = (Option *)(ulong)(uVar59 * 4);
    if (100 < iVar67) {
      _elemsize = opt_00;
    }
    Mat::create(top_blob,iVar60,iVar66,(int)uVar49 / (int)uVar59,(size_t)_elemsize,uVar59,
                opt->blob_allocator);
    iVar61 = -100;
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_004434b3;
    iVar61 = 0;
    if (iVar54 != 1) {
      if (iVar54 == 8) {
        uVar57 = (long)*(int *)(&this->field_0xd8 +
                               (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]) *
                 (long)*(int *)(&this->field_0xd4 +
                               (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_2f8,uVar57,
                   (allocator_type *)&local_238);
        pp_Var4 = this->_vptr_ConvolutionDepthWise_x86_avx512;
        p_Var62 = pp_Var4[-3];
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var62)) {
          iVar66 = *(int *)(&this->field_0xe0 + (long)p_Var62);
          iVar60 = *(int *)(&this->field_0xdc + (long)p_Var62);
          iVar54 = *(int *)(&this->field_0xd4 + (long)p_Var62);
          iVar61 = 0;
          fVar63 = 0.0;
          iVar64 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var4[-3])) {
              lVar53 = 0;
              do {
                *(float *)(local_2f8._0_8_ + (iVar61 + lVar53) * 4) = fVar63;
                fVar63 = (float)((int)fVar63 + *(int *)(&this->field_0xdc + (long)pp_Var4[-3]));
                lVar53 = lVar53 + 1;
              } while ((int)lVar53 < *(int *)(&this->field_0xd4 + (long)pp_Var4[-3]));
              iVar61 = iVar61 + (int)lVar53;
            }
            fVar63 = (float)((int)fVar63 + (iVar66 * iVar46 - iVar60 * iVar54));
            iVar64 = iVar64 + 1;
          } while (iVar64 < *(int *)(&this->field_0xd8 + (long)pp_Var4[-3]));
        }
        local_1d0 = (_func_int **)CONCAT44(local_1d0._4_4_,iVar46);
        if (0 < iVar50) {
          iVar66 = (int)uVar57 * 8;
          local_1f0 = CONCAT44(local_1f0._4_4_,iVar66);
          local_290 = 0;
          auVar106._8_4_ = 0x80000000;
          auVar106._0_8_ = 0x8000000080000000;
          auVar106._12_4_ = 0x80000000;
          auVar107._8_4_ = 0x3f000000;
          auVar107._0_8_ = 0x3f0000003f000000;
          auVar107._12_4_ = 0x3f000000;
          auVar72 = vpbroadcastw_avx512vl(ZEXT216(0x7f));
          auVar73 = vpbroadcastw_avx512vl(ZEXT216(0xff81));
          auVar74 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar75 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
          auVar142._8_4_ = 0x3f000000;
          auVar142._0_8_ = 0x3f0000003f000000;
          auVar142._12_4_ = 0x3f000000;
          auVar143._8_4_ = 0x3fb8aa3b;
          auVar143._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar143._12_4_ = 0x3fb8aa3b;
          auVar144._8_4_ = 0x3f800000;
          auVar144._0_8_ = 0x3f8000003f800000;
          auVar144._12_4_ = 0x3f800000;
          auVar145._8_4_ = 0x3f318000;
          auVar145._0_8_ = 0x3f3180003f318000;
          auVar145._12_4_ = 0x3f318000;
          auVar148._8_4_ = 0x39506967;
          auVar148._0_8_ = 0x3950696739506967;
          auVar148._12_4_ = 0x39506967;
          auVar149._8_4_ = 0x3ab743ce;
          auVar149._0_8_ = 0x3ab743ce3ab743ce;
          auVar149._12_4_ = 0x3ab743ce;
          auVar150._8_4_ = 0x3c088908;
          auVar150._0_8_ = 0x3c0889083c088908;
          auVar150._12_4_ = 0x3c088908;
          auVar151._8_4_ = 0x3d2aa9c1;
          auVar151._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar151._12_4_ = 0x3d2aa9c1;
          auVar76 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar77 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          auVar78 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
          auVar79 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
          auVar81 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
          auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
          auVar83 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
          local_298 = 0;
          auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar85 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
          do {
            if (-1 < (int)local_1d8) {
              local_2a0 = (_func_int ***)
                          ((long)(_func_int ***)local_288.data +
                          local_288.cstep * local_298 *
                          CONCAT44(local_288.elemsize._4_4_,(int)local_288.elemsize));
              pauVar68 = (undefined1 (*) [16])
                         (top_blob->elemsize * local_298 * top_blob->cstep + (long)top_blob->data);
              pp_Var4 = this->_vptr_ConvolutionDepthWise_x86_avx512;
              local_2a8 = (float *)((long)local_288.w *
                                   CONCAT44(local_288.elemsize._4_4_,(int)local_288.elemsize));
              pvVar5 = (this->weight_data_tm).data;
              local_1e0 = 0;
              pauVar69 = pauVar68;
              do {
                if (-1 < iVar55) {
                  local_2b0 = (float *)(long)(int)local_1e0;
                  iVar60 = 0;
                  do {
                    p_Var62 = pp_Var4[-3];
                    if ((int)uVar57 < 1) {
                      auVar104 = ZEXT816(0) << 0x40;
                      auVar86 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
                    }
                    else {
                      auVar112 = ZEXT1664((undefined1  [16])0x0);
                      uVar70 = 0;
                      auVar146 = ZEXT1664((undefined1  [16])0x0);
                      do {
                        auVar86._8_8_ = 0;
                        auVar86._0_8_ =
                             *(ulong *)((long)(local_2a0 +
                                              (int)*(pointer)(local_2f8._0_8_ + uVar70 * 4)) +
                                       (long)*(int *)(&this->field_0xe8 + (long)p_Var62) *
                                       (long)local_2b0 * (long)local_2a8 +
                                       (long)(*(int *)(&this->field_0xe4 + (long)p_Var62) * iVar60 *
                                             8));
                        auVar104 = vpcmpgtb_avx((undefined1  [16])0x0,auVar86);
                        auVar86 = vpunpcklbw_avx(auVar86,auVar104);
                        auVar90._8_8_ = 0;
                        auVar90._0_8_ = *(ulong *)((long)pvVar5 + uVar70 * 8 + (long)(int)local_290)
                        ;
                        auVar104 = vpcmpgtb_avx((undefined1  [16])0x0,auVar90);
                        auVar104 = vpunpcklbw_avx(auVar90,auVar104);
                        auVar90 = vpmullw_avx(auVar104,auVar86);
                        auVar86 = vpmulhw_avx(auVar86,auVar104);
                        auVar104 = vpunpcklwd_avx(auVar90,auVar86);
                        auVar104 = vpaddd_avx(auVar112._0_16_,auVar104);
                        auVar112 = ZEXT1664(auVar104);
                        auVar86 = vpunpckhwd_avx(auVar90,auVar86);
                        auVar90 = vpaddd_avx(auVar146._0_16_,auVar86);
                        auVar146 = ZEXT1664(auVar90);
                        uVar70 = uVar70 + 1;
                      } while ((uVar57 & 0xffffffff) != uVar70);
                      auVar86 = vcvtdq2ps_avx512vl(auVar104);
                      auVar104 = vcvtdq2ps_avx(auVar90);
                    }
                    in_ZMM22 = ZEXT1664(auVar86);
                    auVar90 = *(undefined1 (*) [16])
                               (*(long *)(&this->field_0x1f8 + (long)p_Var62) + local_298 * 0x20);
                    auVar102 = *(undefined1 (*) [16])
                                (*(long *)(&this->field_0x1f8 + (long)p_Var62) + 0x10 +
                                local_298 * 0x20);
                    pfVar56 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var62) +
                                       local_298 * 0x20);
                    auVar89._0_4_ = auVar90._0_4_ * *pfVar56;
                    auVar89._4_4_ = auVar90._4_4_ * pfVar56[1];
                    auVar89._8_4_ = auVar90._8_4_ * pfVar56[2];
                    auVar89._12_4_ = auVar90._12_4_ * pfVar56[3];
                    auVar89 = vrcpps_avx(auVar89);
                    auVar87 = vmulps_avx512vl(auVar102,*(undefined1 (*) [16])
                                                        (*(long *)(&this->field_0x240 +
                                                                  (long)p_Var62) + 0x10 +
                                                        local_298 * 0x20));
                    auVar87 = vrcpps_avx(auVar87);
                    uVar70 = vcmpps_avx512vl(auVar90,(undefined1  [16])0x0,4);
                    uVar52 = vcmpps_avx512vl(auVar102,(undefined1  [16])0x0,4);
                    auVar88._4_4_ = (uint)((byte)(uVar70 >> 1) & 1) * auVar89._4_4_;
                    auVar88._0_4_ = (uint)((byte)uVar70 & 1) * auVar89._0_4_;
                    auVar88._8_4_ = (uint)((byte)(uVar70 >> 2) & 1) * auVar89._8_4_;
                    auVar88._12_4_ = (uint)((byte)(uVar70 >> 3) & 1) * auVar89._12_4_;
                    auVar86 = vmulps_avx512vl(auVar88,auVar86);
                    auVar102._0_4_ =
                         (float)((uint)((byte)uVar52 & 1) * auVar87._0_4_) * auVar104._0_4_;
                    auVar102._4_4_ =
                         (float)((uint)((byte)(uVar52 >> 1) & 1) * auVar87._4_4_) * auVar104._4_4_;
                    auVar102._8_4_ =
                         (float)((uint)((byte)(uVar52 >> 2) & 1) * auVar87._8_4_) * auVar104._8_4_;
                    auVar102._12_4_ =
                         (float)((uint)((byte)(uVar52 >> 3) & 1) * auVar87._12_4_) * auVar104._12_4_
                    ;
                    auVar104 = auVar86;
                    if (*(int *)(&this->field_0x100 + (long)p_Var62) != 0) {
                      pfVar56 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var62) +
                                         local_298 * 0x20);
                      auVar104._0_4_ = auVar86._0_4_ + *pfVar56;
                      auVar104._4_4_ = auVar86._4_4_ + pfVar56[1];
                      auVar104._8_4_ = auVar86._8_4_ + pfVar56[2];
                      auVar104._12_4_ = auVar86._12_4_ + pfVar56[3];
                      pfVar56 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var62) + 0x10 +
                                         local_298 * 0x20);
                      auVar102._0_4_ = auVar102._0_4_ + *pfVar56;
                      auVar102._4_4_ = auVar102._4_4_ + pfVar56[1];
                      auVar102._8_4_ = auVar102._8_4_ + pfVar56[2];
                      auVar102._12_4_ = auVar102._12_4_ + pfVar56[3];
                    }
                    iVar54 = *(int *)(&this->field_0x110 + (long)p_Var62) + -1;
                    fVar63 = auVar104._4_4_;
                    fVar105 = auVar104._8_4_;
                    fVar147 = auVar104._12_4_;
                    switch(iVar54) {
                    case 0:
                      auVar104 = vmaxps_avx(auVar104,(undefined1  [16])0x0);
                      break;
                    case 1:
                      auVar86 = vmaxps_avx(auVar104,(undefined1  [16])0x0);
                      auVar104 = vminps_avx(auVar104,(undefined1  [16])0x0);
                      uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var62);
                      auVar20._4_4_ = uVar1;
                      auVar20._0_4_ = uVar1;
                      auVar20._8_4_ = uVar1;
                      auVar20._12_4_ = uVar1;
                      auVar104 = vfmadd132ps_avx512vl(auVar104,auVar86,auVar20);
                      break;
                    case 2:
                      uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var62);
                      auVar18._4_4_ = uVar1;
                      auVar18._0_4_ = uVar1;
                      auVar18._8_4_ = uVar1;
                      auVar18._12_4_ = uVar1;
                      auVar104 = vmaxps_avx512vl(auVar104,auVar18);
                      uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var62))[1];
                      auVar19._4_4_ = uVar1;
                      auVar19._0_4_ = uVar1;
                      auVar19._8_4_ = uVar1;
                      auVar19._12_4_ = uVar1;
                      auVar104 = vminps_avx512vl(auVar104,auVar19);
                      break;
                    case 3:
                      auVar115._0_8_ = auVar104._0_8_ ^ 0x8000000080000000;
                      auVar115._8_4_ = -fVar105;
                      auVar115._12_4_ = -fVar147;
                      auVar104 = vminps_avx512vl(auVar115,auVar74);
                      auVar90 = vmaxps_avx512vl(auVar104,auVar75);
                      auVar86 = vfmadd231ps_fma(auVar142,auVar90,auVar143);
                      auVar138._0_4_ = (int)auVar86._0_4_;
                      auVar138._4_4_ = (int)auVar86._4_4_;
                      auVar138._8_4_ = (int)auVar86._8_4_;
                      auVar138._12_4_ = (int)auVar86._12_4_;
                      auVar104 = vcvtdq2ps_avx(auVar138);
                      uVar70 = vcmpps_avx512vl(auVar86,auVar104,1);
                      auVar86 = vsubps_avx512vl(auVar104,auVar144);
                      bVar71 = (bool)((byte)uVar70 & 1);
                      auVar96._0_4_ =
                           (float)((uint)bVar71 * auVar86._0_4_ | (uint)!bVar71 * auVar104._0_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 1) & 1);
                      auVar96._4_4_ =
                           (float)((uint)bVar71 * auVar86._4_4_ | (uint)!bVar71 * auVar104._4_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 2) & 1);
                      auVar96._8_4_ =
                           (float)((uint)bVar71 * auVar86._8_4_ | (uint)!bVar71 * auVar104._8_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 3) & 1);
                      auVar96._12_4_ =
                           (float)((uint)bVar71 * auVar86._12_4_ | (uint)!bVar71 * auVar104._12_4_);
                      auVar104 = vfmsub231ps_fma(auVar90,auVar96,auVar145);
                      auVar17._8_4_ = 0x395e8083;
                      auVar17._0_8_ = 0x395e8083395e8083;
                      auVar17._12_4_ = 0x395e8083;
                      auVar86 = vfmsub231ps_avx512vl(auVar104,auVar96,auVar17);
                      auVar128._0_4_ = auVar86._0_4_ * auVar86._0_4_;
                      auVar128._4_4_ = auVar86._4_4_ * auVar86._4_4_;
                      auVar128._8_4_ = auVar86._8_4_ * auVar86._8_4_;
                      auVar128._12_4_ = auVar86._12_4_ * auVar86._12_4_;
                      auVar104 = vfmadd213ps_fma(auVar148,auVar86,auVar149);
                      auVar104 = vfmadd213ps_fma(auVar104,auVar86,auVar150);
                      auVar104 = vfmadd213ps_fma(auVar104,auVar86,auVar151);
                      auVar104 = vfmadd213ps_avx512vl(auVar104,auVar86,auVar76);
                      auVar104 = vfmadd213ps_fma(auVar104,auVar86,auVar142);
                      auVar104 = vfmadd213ps_fma(auVar104,auVar128,auVar86);
                      auVar116._0_4_ = auVar104._0_4_ + 1.0;
                      auVar116._4_4_ = auVar104._4_4_ + 1.0;
                      auVar116._8_4_ = auVar104._8_4_ + 1.0;
                      auVar116._12_4_ = auVar104._12_4_ + 1.0;
                      auVar129._0_4_ = (int)auVar96._0_4_;
                      auVar129._4_4_ = (int)auVar96._4_4_;
                      auVar129._8_4_ = (int)auVar96._8_4_;
                      auVar129._12_4_ = (int)auVar96._12_4_;
                      auVar104 = vpslld_avx(auVar129,0x17);
                      auVar104 = vpaddd_avx512vl(auVar104,auVar77);
                      auVar86 = vfmadd213ps_fma(auVar104,auVar116,auVar144);
                      auVar104 = vrcpps_avx(auVar86);
                      auVar86 = vfmsub213ps_fma(auVar86,auVar104,auVar144);
                      auVar104 = vfnmadd132ps_fma(auVar86,auVar104,auVar104);
                      break;
                    case 4:
                      auVar86 = vminps_avx512vl(auVar104,auVar74);
                      auVar89 = vmaxps_avx512vl(auVar86,auVar75);
                      auVar90 = vfmadd213ps_fma(auVar143,auVar89,auVar142);
                      auVar135._0_4_ = (int)auVar90._0_4_;
                      auVar135._4_4_ = (int)auVar90._4_4_;
                      auVar135._8_4_ = (int)auVar90._8_4_;
                      auVar135._12_4_ = (int)auVar90._12_4_;
                      auVar86 = vcvtdq2ps_avx(auVar135);
                      uVar70 = vcmpps_avx512vl(auVar90,auVar86,1);
                      auVar90 = vsubps_avx512vl(auVar86,auVar144);
                      bVar71 = (bool)((byte)uVar70 & 1);
                      auVar91._0_4_ =
                           (float)((uint)bVar71 * auVar90._0_4_ | (uint)!bVar71 * auVar86._0_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 1) & 1);
                      auVar91._4_4_ =
                           (float)((uint)bVar71 * auVar90._4_4_ | (uint)!bVar71 * auVar86._4_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 2) & 1);
                      auVar91._8_4_ =
                           (float)((uint)bVar71 * auVar90._8_4_ | (uint)!bVar71 * auVar86._8_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 3) & 1);
                      auVar91._12_4_ =
                           (float)((uint)bVar71 * auVar90._12_4_ | (uint)!bVar71 * auVar86._12_4_);
                      auVar86 = vfmsub231ps_fma(auVar89,auVar91,auVar145);
                      auVar86 = vfnmsub231ps_avx512vl(auVar86,auVar91,auVar78);
                      auVar124._0_4_ = auVar86._0_4_ * auVar86._0_4_;
                      auVar124._4_4_ = auVar86._4_4_ * auVar86._4_4_;
                      auVar124._8_4_ = auVar86._8_4_ * auVar86._8_4_;
                      auVar124._12_4_ = auVar86._12_4_ * auVar86._12_4_;
                      auVar90 = vfmadd213ps_avx512vl(auVar148,auVar86,auVar149);
                      auVar90 = vfmadd213ps_avx512vl(auVar90,auVar86,auVar150);
                      auVar90 = vfmadd213ps_avx512vl(auVar90,auVar86,auVar151);
                      auVar90 = vfmadd213ps_avx512vl(auVar90,auVar86,auVar76);
                      auVar90 = vfmadd213ps_avx512vl(auVar90,auVar86,auVar142);
                      auVar86 = vfmadd213ps_avx512vl(auVar90,auVar124,auVar86);
                      auVar86 = vaddps_avx512vl(auVar86,auVar144);
                      auVar125._0_4_ = (int)auVar91._0_4_;
                      auVar125._4_4_ = (int)auVar91._4_4_;
                      auVar125._8_4_ = (int)auVar91._8_4_;
                      auVar125._12_4_ = (int)auVar91._12_4_;
                      auVar90 = vpslld_avx(auVar125,0x17);
                      auVar90 = vpaddd_avx512vl(auVar90,auVar77);
                      auVar86 = vfmadd213ps_fma(auVar90,auVar86,auVar144);
                      uVar70 = vcmpps_avx512vl(auVar86,(undefined1  [16])0x0,2);
                      auVar9._8_4_ = 0x800000;
                      auVar9._0_8_ = 0x80000000800000;
                      auVar9._12_4_ = 0x800000;
                      auVar86 = vmaxps_avx512vl(auVar86,auVar9);
                      auVar89 = vpsrld_avx(auVar86,0x17);
                      auVar10._8_4_ = 0x807fffff;
                      auVar10._0_8_ = 0x807fffff807fffff;
                      auVar10._12_4_ = 0x807fffff;
                      auVar86 = vpternlogd_avx512vl(auVar86,auVar107,auVar10,0xec);
                      auVar11._8_4_ = 0x3f3504f3;
                      auVar11._0_8_ = 0x3f3504f33f3504f3;
                      auVar11._12_4_ = 0x3f3504f3;
                      uVar52 = vcmpps_avx512vl(auVar86,auVar11,1);
                      auVar12._8_4_ = 0xbf800000;
                      auVar12._0_8_ = 0xbf800000bf800000;
                      auVar12._12_4_ = 0xbf800000;
                      auVar90 = vaddps_avx512vl(auVar86,auVar12);
                      auVar86 = vaddps_avx512vl(auVar90,auVar86);
                      bVar71 = (bool)((byte)uVar52 & 1);
                      auVar92._0_4_ =
                           (float)((uint)bVar71 * auVar86._0_4_ | (uint)!bVar71 * auVar90._0_4_);
                      bVar71 = (bool)((byte)(uVar52 >> 1) & 1);
                      auVar92._4_4_ =
                           (float)((uint)bVar71 * auVar86._4_4_ | (uint)!bVar71 * auVar90._4_4_);
                      bVar71 = (bool)((byte)(uVar52 >> 2) & 1);
                      auVar92._8_4_ =
                           (float)((uint)bVar71 * auVar86._8_4_ | (uint)!bVar71 * auVar90._8_4_);
                      bVar71 = (bool)((byte)(uVar52 >> 3) & 1);
                      auVar92._12_4_ =
                           (float)((uint)bVar71 * auVar86._12_4_ | (uint)!bVar71 * auVar90._12_4_);
                      auVar114._0_4_ = auVar92._0_4_ * auVar92._0_4_;
                      auVar114._4_4_ = auVar92._4_4_ * auVar92._4_4_;
                      auVar114._8_4_ = auVar92._8_4_ * auVar92._8_4_;
                      auVar114._12_4_ = auVar92._12_4_ * auVar92._12_4_;
                      auVar13._8_4_ = 0xbdebd1b8;
                      auVar13._0_8_ = 0xbdebd1b8bdebd1b8;
                      auVar13._12_4_ = 0xbdebd1b8;
                      auVar86 = vfmadd213ps_avx512vl(auVar79,auVar92,auVar13);
                      auVar14._8_4_ = 0x3def251a;
                      auVar14._0_8_ = 0x3def251a3def251a;
                      auVar14._12_4_ = 0x3def251a;
                      auVar86 = vfmadd213ps_avx512vl(auVar86,auVar92,auVar14);
                      auVar15._8_4_ = 0xbdfe5d4f;
                      auVar15._0_8_ = 0xbdfe5d4fbdfe5d4f;
                      auVar15._12_4_ = 0xbdfe5d4f;
                      auVar86 = vfmadd213ps_avx512vl(auVar86,auVar92,auVar15);
                      auVar86 = vfmadd213ps_avx512vl(auVar86,auVar92,auVar80);
                      auVar86 = vfmadd213ps_avx512vl(auVar86,auVar92,auVar81);
                      auVar86 = vfmadd213ps_avx512vl(auVar86,auVar92,auVar82);
                      auVar86 = vfmadd213ps_avx512vl(auVar86,auVar92,auVar83);
                      auVar86 = vfmadd213ps_avx512vl(auVar86,auVar92,auVar84);
                      auVar90 = vmulps_avx512vl(auVar114,auVar92);
                      auVar90 = vmulps_avx512vl(auVar90,auVar86);
                      auVar16._8_4_ = 0xffffff82;
                      auVar16._0_8_ = 0xffffff82ffffff82;
                      auVar16._12_4_ = 0xffffff82;
                      auVar86 = vpaddd_avx512vl(auVar89,auVar16);
                      auVar86 = vcvtdq2ps_avx(auVar86);
                      auVar89 = vsubps_avx512vl(auVar86,auVar144);
                      bVar71 = (bool)((byte)uVar52 & 1);
                      auVar93._0_4_ = (uint)bVar71 * auVar89._0_4_ | (uint)!bVar71 * auVar86._0_4_;
                      bVar71 = (bool)((byte)(uVar52 >> 1) & 1);
                      auVar93._4_4_ = (uint)bVar71 * auVar89._4_4_ | (uint)!bVar71 * auVar86._4_4_;
                      bVar71 = (bool)((byte)(uVar52 >> 2) & 1);
                      auVar93._8_4_ = (uint)bVar71 * auVar89._8_4_ | (uint)!bVar71 * auVar86._8_4_;
                      bVar71 = (bool)((byte)(uVar52 >> 3) & 1);
                      auVar93._12_4_ =
                           (uint)bVar71 * auVar89._12_4_ | (uint)!bVar71 * auVar86._12_4_;
                      auVar86 = vfmadd231ps_avx512vl(auVar90,auVar93,auVar78);
                      auVar86 = vfmsub231ps_avx512vl(auVar86,auVar142,auVar114);
                      auVar86 = vsubps_avx512vl(auVar86,auVar92);
                      auVar86 = vfnmadd231ps_fma(auVar86,auVar145,auVar93);
                      auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      bVar71 = (bool)((byte)uVar70 & 1);
                      auVar94._0_4_ =
                           (uint)bVar71 * auVar90._0_4_ |
                           (uint)!bVar71 * (int)(auVar86._0_4_ + auVar86._0_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 1) & 1);
                      auVar94._4_4_ =
                           (uint)bVar71 * auVar90._4_4_ |
                           (uint)!bVar71 * (int)(auVar86._4_4_ + auVar86._4_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 2) & 1);
                      auVar94._8_4_ =
                           (uint)bVar71 * auVar90._8_4_ |
                           (uint)!bVar71 * (int)(auVar86._8_4_ + auVar86._8_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 3) & 1);
                      auVar94._12_4_ =
                           (uint)bVar71 * auVar90._12_4_ |
                           (uint)!bVar71 * (int)(auVar86._12_4_ + auVar86._12_4_);
                      auVar86 = vminps_avx512vl(auVar94,auVar74);
                      auVar89 = vmaxps_avx512vl(auVar86,auVar75);
                      auVar90 = vfmadd213ps_fma(auVar143,auVar89,auVar142);
                      auVar136._0_4_ = (int)auVar90._0_4_;
                      auVar136._4_4_ = (int)auVar90._4_4_;
                      auVar136._8_4_ = (int)auVar90._8_4_;
                      auVar136._12_4_ = (int)auVar90._12_4_;
                      auVar86 = vcvtdq2ps_avx(auVar136);
                      uVar70 = vcmpps_avx512vl(auVar90,auVar86,1);
                      auVar90 = vsubps_avx512vl(auVar86,auVar144);
                      bVar71 = (bool)((byte)uVar70 & 1);
                      auVar95._0_4_ =
                           (float)((uint)bVar71 * auVar90._0_4_ | (uint)!bVar71 * auVar86._0_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 1) & 1);
                      auVar95._4_4_ =
                           (float)((uint)bVar71 * auVar90._4_4_ | (uint)!bVar71 * auVar86._4_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 2) & 1);
                      auVar95._8_4_ =
                           (float)((uint)bVar71 * auVar90._8_4_ | (uint)!bVar71 * auVar86._8_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 3) & 1);
                      auVar95._12_4_ =
                           (float)((uint)bVar71 * auVar90._12_4_ | (uint)!bVar71 * auVar86._12_4_);
                      auVar86 = vfmsub231ps_fma(auVar89,auVar95,auVar145);
                      auVar86 = vfnmsub231ps_avx512vl(auVar86,auVar95,auVar78);
                      auVar126._0_4_ = auVar86._0_4_ * auVar86._0_4_;
                      auVar126._4_4_ = auVar86._4_4_ * auVar86._4_4_;
                      auVar126._8_4_ = auVar86._8_4_ * auVar86._8_4_;
                      auVar126._12_4_ = auVar86._12_4_ * auVar86._12_4_;
                      auVar90 = vfmadd213ps_avx512vl(auVar148,auVar86,auVar149);
                      auVar90 = vfmadd213ps_avx512vl(auVar90,auVar86,auVar150);
                      auVar90 = vfmadd213ps_avx512vl(auVar90,auVar86,auVar151);
                      auVar90 = vfmadd213ps_avx512vl(auVar90,auVar86,auVar76);
                      auVar90 = vfmadd213ps_avx512vl(auVar90,auVar86,auVar142);
                      auVar86 = vfmadd213ps_avx512vl(auVar90,auVar126,auVar86);
                      in_ZMM22 = ZEXT1664(auVar86);
                      auVar86 = vaddps_avx512vl(auVar86,auVar144);
                      auVar127._0_4_ = (int)auVar95._0_4_;
                      auVar127._4_4_ = (int)auVar95._4_4_;
                      auVar127._8_4_ = (int)auVar95._8_4_;
                      auVar127._12_4_ = (int)auVar95._12_4_;
                      auVar90 = vpslld_avx(auVar127,0x17);
                      auVar90 = vpaddd_avx512vl(auVar90,auVar77);
                      auVar90 = vfmadd213ps_fma(auVar90,auVar86,auVar144);
                      auVar86 = vrcpps_avx(auVar90);
                      auVar137._0_4_ = auVar86._0_4_ + auVar86._0_4_;
                      auVar137._4_4_ = auVar86._4_4_ + auVar86._4_4_;
                      auVar137._8_4_ = auVar86._8_4_ + auVar86._8_4_;
                      auVar137._12_4_ = auVar86._12_4_ + auVar86._12_4_;
                      auVar90 = vfmsub213ps_avx512vl(auVar90,auVar137,auVar85);
                      auVar86 = vfnmadd213ps_fma(auVar90,auVar86,auVar137);
                      auVar104 = vfmsub231ps_fma(auVar104,auVar104,auVar86);
                      break;
                    case 5:
                      uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var62);
                      auVar117._4_4_ = uVar1;
                      auVar117._0_4_ = uVar1;
                      auVar117._8_4_ = uVar1;
                      auVar117._12_4_ = uVar1;
                      uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var62))[1];
                      auVar87._4_4_ = uVar1;
                      auVar87._0_4_ = uVar1;
                      auVar87._8_4_ = uVar1;
                      auVar87._12_4_ = uVar1;
                      auVar86 = vfmadd213ps_avx512vl(auVar117,auVar104,auVar87);
                      auVar86 = vmaxps_avx(auVar86,(undefined1  [16])0x0);
                      auVar86 = vminps_avx(auVar144,auVar86);
                      auVar104._0_4_ = auVar104._0_4_ * auVar86._0_4_;
                      auVar104._4_4_ = fVar63 * auVar86._4_4_;
                      auVar104._8_4_ = fVar105 * auVar86._8_4_;
                      auVar104._12_4_ = fVar147 * auVar86._12_4_;
                    }
                    fVar63 = auVar102._4_4_;
                    fVar105 = auVar102._8_4_;
                    fVar147 = auVar102._12_4_;
                    switch(iVar54) {
                    case 0:
                      auVar102 = vmaxps_avx(auVar102,(undefined1  [16])0x0);
                      break;
                    case 1:
                      auVar86 = vmaxps_avx(auVar102,(undefined1  [16])0x0);
                      auVar90 = vminps_avx(auVar102,(undefined1  [16])0x0);
                      uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var62);
                      auVar33._4_4_ = uVar1;
                      auVar33._0_4_ = uVar1;
                      auVar33._8_4_ = uVar1;
                      auVar33._12_4_ = uVar1;
                      auVar102 = vfmadd132ps_avx512vl(auVar90,auVar86,auVar33);
                      break;
                    case 2:
                      uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var62);
                      auVar31._4_4_ = uVar1;
                      auVar31._0_4_ = uVar1;
                      auVar31._8_4_ = uVar1;
                      auVar31._12_4_ = uVar1;
                      auVar86 = vmaxps_avx512vl(auVar102,auVar31);
                      uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var62))[1];
                      auVar32._4_4_ = uVar1;
                      auVar32._0_4_ = uVar1;
                      auVar32._8_4_ = uVar1;
                      auVar32._12_4_ = uVar1;
                      auVar102 = vminps_avx512vl(auVar86,auVar32);
                      break;
                    case 3:
                      auVar108._0_8_ = auVar102._0_8_ ^ 0x8000000080000000;
                      auVar108._8_4_ = -fVar105;
                      auVar108._12_4_ = -fVar147;
                      auVar86 = vminps_avx512vl(auVar108,auVar74);
                      auVar102 = vmaxps_avx512vl(auVar86,auVar75);
                      auVar90 = vfmadd231ps_fma(auVar142,auVar102,auVar143);
                      auVar134._0_4_ = (int)auVar90._0_4_;
                      auVar134._4_4_ = (int)auVar90._4_4_;
                      auVar134._8_4_ = (int)auVar90._8_4_;
                      auVar134._12_4_ = (int)auVar90._12_4_;
                      auVar86 = vcvtdq2ps_avx(auVar134);
                      uVar70 = vcmpps_avx512vl(auVar90,auVar86,1);
                      auVar90 = vsubps_avx512vl(auVar86,auVar144);
                      bVar71 = (bool)((byte)uVar70 & 1);
                      auVar103._0_4_ =
                           (float)((uint)bVar71 * auVar90._0_4_ | (uint)!bVar71 * auVar86._0_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 1) & 1);
                      auVar103._4_4_ =
                           (float)((uint)bVar71 * auVar90._4_4_ | (uint)!bVar71 * auVar86._4_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 2) & 1);
                      auVar103._8_4_ =
                           (float)((uint)bVar71 * auVar90._8_4_ | (uint)!bVar71 * auVar86._8_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 3) & 1);
                      auVar103._12_4_ =
                           (float)((uint)bVar71 * auVar90._12_4_ | (uint)!bVar71 * auVar86._12_4_);
                      auVar86 = vfmsub231ps_fma(auVar102,auVar103,auVar145);
                      auVar30._8_4_ = 0x395e8083;
                      auVar30._0_8_ = 0x395e8083395e8083;
                      auVar30._12_4_ = 0x395e8083;
                      auVar90 = vfmsub231ps_avx512vl(auVar86,auVar103,auVar30);
                      auVar119._0_4_ = auVar90._0_4_ * auVar90._0_4_;
                      auVar119._4_4_ = auVar90._4_4_ * auVar90._4_4_;
                      auVar119._8_4_ = auVar90._8_4_ * auVar90._8_4_;
                      auVar119._12_4_ = auVar90._12_4_ * auVar90._12_4_;
                      auVar86 = vfmadd213ps_fma(auVar148,auVar90,auVar149);
                      auVar86 = vfmadd213ps_fma(auVar86,auVar90,auVar150);
                      auVar86 = vfmadd213ps_fma(auVar86,auVar90,auVar151);
                      auVar86 = vfmadd213ps_avx512vl(auVar86,auVar90,auVar76);
                      auVar86 = vfmadd213ps_fma(auVar86,auVar90,auVar142);
                      auVar86 = vfmadd213ps_fma(auVar86,auVar119,auVar90);
                      auVar120._0_4_ = auVar86._0_4_ + 1.0;
                      auVar120._4_4_ = auVar86._4_4_ + 1.0;
                      auVar120._8_4_ = auVar86._8_4_ + 1.0;
                      auVar120._12_4_ = auVar86._12_4_ + 1.0;
                      auVar109._0_4_ = (int)auVar103._0_4_;
                      auVar109._4_4_ = (int)auVar103._4_4_;
                      auVar109._8_4_ = (int)auVar103._8_4_;
                      auVar109._12_4_ = (int)auVar103._12_4_;
                      auVar86 = vpslld_avx(auVar109,0x17);
                      auVar86 = vpaddd_avx512vl(auVar86,auVar77);
                      auVar90 = vfmadd213ps_fma(auVar86,auVar120,auVar144);
                      auVar86 = vrcpps_avx(auVar90);
                      auVar90 = vfmsub213ps_fma(auVar90,auVar86,auVar144);
                      auVar102 = vfnmadd132ps_fma(auVar90,auVar86,auVar86);
                      break;
                    case 4:
                      auVar86 = vminps_avx512vl(auVar102,auVar74);
                      auVar89 = vmaxps_avx512vl(auVar86,auVar75);
                      auVar90 = vfmadd213ps_fma(auVar143,auVar89,auVar142);
                      auVar139._0_4_ = (int)auVar90._0_4_;
                      auVar139._4_4_ = (int)auVar90._4_4_;
                      auVar139._8_4_ = (int)auVar90._8_4_;
                      auVar139._12_4_ = (int)auVar90._12_4_;
                      auVar86 = vcvtdq2ps_avx(auVar139);
                      uVar70 = vcmpps_avx512vl(auVar90,auVar86,1);
                      auVar90 = vsubps_avx512vl(auVar86,auVar144);
                      bVar71 = (bool)((byte)uVar70 & 1);
                      auVar97._0_4_ =
                           (float)((uint)bVar71 * auVar90._0_4_ | (uint)!bVar71 * auVar86._0_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 1) & 1);
                      auVar97._4_4_ =
                           (float)((uint)bVar71 * auVar90._4_4_ | (uint)!bVar71 * auVar86._4_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 2) & 1);
                      auVar97._8_4_ =
                           (float)((uint)bVar71 * auVar90._8_4_ | (uint)!bVar71 * auVar86._8_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 3) & 1);
                      auVar97._12_4_ =
                           (float)((uint)bVar71 * auVar90._12_4_ | (uint)!bVar71 * auVar86._12_4_);
                      auVar86 = vfmsub231ps_fma(auVar89,auVar97,auVar145);
                      auVar86 = vfnmsub231ps_avx512vl(auVar86,auVar97,auVar78);
                      auVar130._0_4_ = auVar86._0_4_ * auVar86._0_4_;
                      auVar130._4_4_ = auVar86._4_4_ * auVar86._4_4_;
                      auVar130._8_4_ = auVar86._8_4_ * auVar86._8_4_;
                      auVar130._12_4_ = auVar86._12_4_ * auVar86._12_4_;
                      auVar90 = vfmadd213ps_avx512vl(auVar148,auVar86,auVar149);
                      auVar90 = vfmadd213ps_avx512vl(auVar90,auVar86,auVar150);
                      auVar90 = vfmadd213ps_avx512vl(auVar90,auVar86,auVar151);
                      auVar90 = vfmadd213ps_avx512vl(auVar90,auVar86,auVar76);
                      auVar90 = vfmadd213ps_avx512vl(auVar90,auVar86,auVar142);
                      auVar86 = vfmadd213ps_avx512vl(auVar90,auVar130,auVar86);
                      auVar86 = vaddps_avx512vl(auVar86,auVar144);
                      auVar131._0_4_ = (int)auVar97._0_4_;
                      auVar131._4_4_ = (int)auVar97._4_4_;
                      auVar131._8_4_ = (int)auVar97._8_4_;
                      auVar131._12_4_ = (int)auVar97._12_4_;
                      auVar90 = vpslld_avx(auVar131,0x17);
                      auVar90 = vpaddd_avx512vl(auVar90,auVar77);
                      auVar86 = vfmadd213ps_fma(auVar90,auVar86,auVar144);
                      uVar70 = vcmpps_avx512vl(auVar86,(undefined1  [16])0x0,2);
                      auVar22._8_4_ = 0x800000;
                      auVar22._0_8_ = 0x80000000800000;
                      auVar22._12_4_ = 0x800000;
                      auVar86 = vmaxps_avx512vl(auVar86,auVar22);
                      auVar89 = vpsrld_avx(auVar86,0x17);
                      auVar23._8_4_ = 0x807fffff;
                      auVar23._0_8_ = 0x807fffff807fffff;
                      auVar23._12_4_ = 0x807fffff;
                      auVar86 = vpternlogd_avx512vl(auVar86,auVar107,auVar23,0xec);
                      auVar24._8_4_ = 0x3f3504f3;
                      auVar24._0_8_ = 0x3f3504f33f3504f3;
                      auVar24._12_4_ = 0x3f3504f3;
                      uVar52 = vcmpps_avx512vl(auVar86,auVar24,1);
                      auVar25._8_4_ = 0xbf800000;
                      auVar25._0_8_ = 0xbf800000bf800000;
                      auVar25._12_4_ = 0xbf800000;
                      auVar90 = vaddps_avx512vl(auVar86,auVar25);
                      auVar86 = vaddps_avx512vl(auVar90,auVar86);
                      bVar71 = (bool)((byte)uVar52 & 1);
                      auVar98._0_4_ =
                           (float)((uint)bVar71 * auVar86._0_4_ | (uint)!bVar71 * auVar90._0_4_);
                      bVar71 = (bool)((byte)(uVar52 >> 1) & 1);
                      auVar98._4_4_ =
                           (float)((uint)bVar71 * auVar86._4_4_ | (uint)!bVar71 * auVar90._4_4_);
                      bVar71 = (bool)((byte)(uVar52 >> 2) & 1);
                      auVar98._8_4_ =
                           (float)((uint)bVar71 * auVar86._8_4_ | (uint)!bVar71 * auVar90._8_4_);
                      bVar71 = (bool)((byte)(uVar52 >> 3) & 1);
                      auVar98._12_4_ =
                           (float)((uint)bVar71 * auVar86._12_4_ | (uint)!bVar71 * auVar90._12_4_);
                      auVar118._0_4_ = auVar98._0_4_ * auVar98._0_4_;
                      auVar118._4_4_ = auVar98._4_4_ * auVar98._4_4_;
                      auVar118._8_4_ = auVar98._8_4_ * auVar98._8_4_;
                      auVar118._12_4_ = auVar98._12_4_ * auVar98._12_4_;
                      auVar26._8_4_ = 0xbdebd1b8;
                      auVar26._0_8_ = 0xbdebd1b8bdebd1b8;
                      auVar26._12_4_ = 0xbdebd1b8;
                      auVar86 = vfmadd213ps_avx512vl(auVar79,auVar98,auVar26);
                      auVar27._8_4_ = 0x3def251a;
                      auVar27._0_8_ = 0x3def251a3def251a;
                      auVar27._12_4_ = 0x3def251a;
                      auVar86 = vfmadd213ps_avx512vl(auVar86,auVar98,auVar27);
                      auVar28._8_4_ = 0xbdfe5d4f;
                      auVar28._0_8_ = 0xbdfe5d4fbdfe5d4f;
                      auVar28._12_4_ = 0xbdfe5d4f;
                      auVar86 = vfmadd213ps_avx512vl(auVar86,auVar98,auVar28);
                      auVar86 = vfmadd213ps_avx512vl(auVar86,auVar98,auVar80);
                      auVar86 = vfmadd213ps_avx512vl(auVar86,auVar98,auVar81);
                      auVar86 = vfmadd213ps_avx512vl(auVar86,auVar98,auVar82);
                      auVar86 = vfmadd213ps_avx512vl(auVar86,auVar98,auVar83);
                      auVar86 = vfmadd213ps_avx512vl(auVar86,auVar98,auVar84);
                      auVar90 = vmulps_avx512vl(auVar118,auVar98);
                      auVar90 = vmulps_avx512vl(auVar90,auVar86);
                      auVar29._8_4_ = 0xffffff82;
                      auVar29._0_8_ = 0xffffff82ffffff82;
                      auVar29._12_4_ = 0xffffff82;
                      auVar86 = vpaddd_avx512vl(auVar89,auVar29);
                      auVar86 = vcvtdq2ps_avx(auVar86);
                      auVar89 = vsubps_avx512vl(auVar86,auVar144);
                      bVar71 = (bool)((byte)uVar52 & 1);
                      auVar99._0_4_ = (uint)bVar71 * auVar89._0_4_ | (uint)!bVar71 * auVar86._0_4_;
                      bVar71 = (bool)((byte)(uVar52 >> 1) & 1);
                      auVar99._4_4_ = (uint)bVar71 * auVar89._4_4_ | (uint)!bVar71 * auVar86._4_4_;
                      bVar71 = (bool)((byte)(uVar52 >> 2) & 1);
                      auVar99._8_4_ = (uint)bVar71 * auVar89._8_4_ | (uint)!bVar71 * auVar86._8_4_;
                      bVar71 = (bool)((byte)(uVar52 >> 3) & 1);
                      auVar99._12_4_ =
                           (uint)bVar71 * auVar89._12_4_ | (uint)!bVar71 * auVar86._12_4_;
                      auVar86 = vfmadd231ps_avx512vl(auVar90,auVar99,auVar78);
                      auVar86 = vfmsub231ps_avx512vl(auVar86,auVar142,auVar118);
                      auVar86 = vsubps_avx512vl(auVar86,auVar98);
                      auVar86 = vfnmadd231ps_fma(auVar86,auVar145,auVar99);
                      auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      bVar71 = (bool)((byte)uVar70 & 1);
                      auVar100._0_4_ =
                           (uint)bVar71 * auVar90._0_4_ |
                           (uint)!bVar71 * (int)(auVar86._0_4_ + auVar86._0_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 1) & 1);
                      auVar100._4_4_ =
                           (uint)bVar71 * auVar90._4_4_ |
                           (uint)!bVar71 * (int)(auVar86._4_4_ + auVar86._4_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 2) & 1);
                      auVar100._8_4_ =
                           (uint)bVar71 * auVar90._8_4_ |
                           (uint)!bVar71 * (int)(auVar86._8_4_ + auVar86._8_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 3) & 1);
                      auVar100._12_4_ =
                           (uint)bVar71 * auVar90._12_4_ |
                           (uint)!bVar71 * (int)(auVar86._12_4_ + auVar86._12_4_);
                      auVar86 = vminps_avx512vl(auVar100,auVar74);
                      auVar89 = vmaxps_avx512vl(auVar86,auVar75);
                      auVar90 = vfmadd213ps_fma(auVar143,auVar89,auVar142);
                      auVar140._0_4_ = (int)auVar90._0_4_;
                      auVar140._4_4_ = (int)auVar90._4_4_;
                      auVar140._8_4_ = (int)auVar90._8_4_;
                      auVar140._12_4_ = (int)auVar90._12_4_;
                      auVar86 = vcvtdq2ps_avx(auVar140);
                      uVar70 = vcmpps_avx512vl(auVar90,auVar86,1);
                      auVar90 = vsubps_avx512vl(auVar86,auVar144);
                      bVar71 = (bool)((byte)uVar70 & 1);
                      auVar101._0_4_ =
                           (float)((uint)bVar71 * auVar90._0_4_ | (uint)!bVar71 * auVar86._0_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 1) & 1);
                      auVar101._4_4_ =
                           (float)((uint)bVar71 * auVar90._4_4_ | (uint)!bVar71 * auVar86._4_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 2) & 1);
                      auVar101._8_4_ =
                           (float)((uint)bVar71 * auVar90._8_4_ | (uint)!bVar71 * auVar86._8_4_);
                      bVar71 = (bool)((byte)(uVar70 >> 3) & 1);
                      auVar101._12_4_ =
                           (float)((uint)bVar71 * auVar90._12_4_ | (uint)!bVar71 * auVar86._12_4_);
                      auVar86 = vfmsub231ps_fma(auVar89,auVar101,auVar145);
                      auVar86 = vfnmsub231ps_avx512vl(auVar86,auVar101,auVar78);
                      auVar132._0_4_ = auVar86._0_4_ * auVar86._0_4_;
                      auVar132._4_4_ = auVar86._4_4_ * auVar86._4_4_;
                      auVar132._8_4_ = auVar86._8_4_ * auVar86._8_4_;
                      auVar132._12_4_ = auVar86._12_4_ * auVar86._12_4_;
                      auVar90 = vfmadd213ps_avx512vl(auVar148,auVar86,auVar149);
                      auVar90 = vfmadd213ps_avx512vl(auVar90,auVar86,auVar150);
                      auVar90 = vfmadd213ps_avx512vl(auVar90,auVar86,auVar151);
                      auVar90 = vfmadd213ps_avx512vl(auVar90,auVar86,auVar76);
                      auVar90 = vfmadd213ps_avx512vl(auVar90,auVar86,auVar142);
                      auVar86 = vfmadd213ps_avx512vl(auVar90,auVar132,auVar86);
                      in_ZMM22 = ZEXT1664(auVar86);
                      auVar86 = vaddps_avx512vl(auVar86,auVar144);
                      auVar133._0_4_ = (int)auVar101._0_4_;
                      auVar133._4_4_ = (int)auVar101._4_4_;
                      auVar133._8_4_ = (int)auVar101._8_4_;
                      auVar133._12_4_ = (int)auVar101._12_4_;
                      auVar90 = vpslld_avx(auVar133,0x17);
                      auVar90 = vpaddd_avx512vl(auVar90,auVar77);
                      auVar90 = vfmadd213ps_fma(auVar90,auVar86,auVar144);
                      auVar86 = vrcpps_avx(auVar90);
                      auVar141._0_4_ = auVar86._0_4_ + auVar86._0_4_;
                      auVar141._4_4_ = auVar86._4_4_ + auVar86._4_4_;
                      auVar141._8_4_ = auVar86._8_4_ + auVar86._8_4_;
                      auVar141._12_4_ = auVar86._12_4_ + auVar86._12_4_;
                      auVar90 = vfmsub213ps_avx512vl(auVar90,auVar141,auVar85);
                      auVar86 = vfnmadd213ps_fma(auVar90,auVar86,auVar141);
                      auVar102 = vfmsub231ps_fma(auVar102,auVar102,auVar86);
                      break;
                    case 5:
                      uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var62);
                      auVar121._4_4_ = uVar1;
                      auVar121._0_4_ = uVar1;
                      auVar121._8_4_ = uVar1;
                      auVar121._12_4_ = uVar1;
                      uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var62))[1];
                      auVar21._4_4_ = uVar1;
                      auVar21._0_4_ = uVar1;
                      auVar21._8_4_ = uVar1;
                      auVar21._12_4_ = uVar1;
                      auVar86 = vfmadd213ps_avx512vl(auVar121,auVar102,auVar21);
                      auVar86 = vmaxps_avx(auVar86,(undefined1  [16])0x0);
                      auVar86 = vminps_avx(auVar144,auVar86);
                      auVar102._0_4_ = auVar86._0_4_ * auVar102._0_4_;
                      auVar102._4_4_ = auVar86._4_4_ * fVar63;
                      auVar102._8_4_ = auVar86._8_4_ * fVar105;
                      auVar102._12_4_ = auVar86._12_4_ * fVar147;
                    }
                    if (iVar67 < 0x65) {
                      *pauVar68 = auVar104;
                      pauVar68[1] = auVar102;
                      pauVar68 = pauVar68 + 2;
                    }
                    else {
                      pfVar56 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var62) +
                                         local_298 * 0x20);
                      auVar122._0_4_ = auVar104._0_4_ * *pfVar56;
                      auVar122._4_4_ = auVar104._4_4_ * pfVar56[1];
                      auVar122._8_4_ = auVar104._8_4_ * pfVar56[2];
                      auVar122._12_4_ = auVar104._12_4_ * pfVar56[3];
                      pfVar56 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var62) + 0x10 +
                                         local_298 * 0x20);
                      auVar110._0_4_ = auVar102._0_4_ * *pfVar56;
                      auVar110._4_4_ = auVar102._4_4_ * pfVar56[1];
                      auVar110._8_4_ = auVar102._8_4_ * pfVar56[2];
                      auVar110._12_4_ = auVar102._12_4_ * pfVar56[3];
                      auVar104 = vpternlogd_avx512vl(auVar107,auVar122,auVar106,0xf8);
                      auVar86 = vpternlogd_avx512vl(auVar107,auVar110,auVar106,0xf8);
                      auVar123._0_4_ = (int)(auVar122._0_4_ + auVar104._0_4_);
                      auVar123._4_4_ = (int)(auVar122._4_4_ + auVar104._4_4_);
                      auVar123._8_4_ = (int)(auVar122._8_4_ + auVar104._8_4_);
                      auVar123._12_4_ = (int)(auVar122._12_4_ + auVar104._12_4_);
                      auVar111._0_4_ = (int)(auVar110._0_4_ + auVar86._0_4_);
                      auVar111._4_4_ = (int)(auVar110._4_4_ + auVar86._4_4_);
                      auVar111._8_4_ = (int)(auVar110._8_4_ + auVar86._8_4_);
                      auVar111._12_4_ = (int)(auVar110._12_4_ + auVar86._12_4_);
                      auVar104 = vpackssdw_avx(auVar123,auVar111);
                      auVar104 = vpminsw_avx512vl(auVar104,auVar72);
                      auVar104 = vpmaxsw_avx512vl(auVar104,auVar73);
                      auVar104 = vpacksswb_avx(auVar104,auVar104);
                      *(long *)*pauVar69 = auVar104._0_8_;
                      pauVar69 = (undefined1 (*) [16])((long)*pauVar69 + 8);
                    }
                    bVar71 = iVar60 != iVar55;
                    iVar60 = iVar60 + 1;
                  } while (bVar71);
                }
                uVar59 = (int)local_1e0 + 1;
                bVar71 = (int)local_1e0 != (int)local_1d8;
                local_1e0 = (ulong)uVar59;
              } while (bVar71);
            }
            local_298 = local_298 + 1;
            local_290 = (ulong)(uint)((int)local_290 + iVar66);
            local_1e8 = uVar58;
          } while (local_298 != uVar58);
        }
        if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ - local_2f8._0_8_);
        }
        iVar61 = 0;
      }
      goto LAB_004434b3;
    }
    p_Var62 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
    iVar66 = *(int *)(&this->field_0xd4 + (long)p_Var62);
    if ((long)iVar66 == 3) {
      if (((((*(int *)(&this->field_0xd8 + (long)p_Var62) == 3) &&
            (*(int *)(&this->field_0xe4 + (long)p_Var62) == 1)) &&
           (*(int *)(&this->field_0xe8 + (long)p_Var62) == 1)) &&
          ((*(int *)(&this->field_0xdc + (long)p_Var62) == 1 &&
           (*(int *)(&this->field_0xe0 + (long)p_Var62) == 1)))) &&
         (*(uint *)(&this->field_0x110 + (long)p_Var62) < 2)) {
        if (iVar67 < 0x65) {
          local_2f8._0_16_ = ZEXT816(0);
          local_2f8._16_8_ = 0;
          p_Var62 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
          if (0 < *(int *)(&this->field_0x108 + (long)p_Var62)) {
            lVar53 = 0;
            do {
              fVar63 = 1.0 / (*(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var62) + lVar53 * 4)
                             * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var62) + lVar53 * 4
                                         ));
              local_238.data = (void *)CONCAT44(local_238.data._4_4_,fVar63);
              if (local_2f8._8_8_ == local_2f8._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_2f8,
                           (iterator)local_2f8._8_8_,(float *)&local_238);
              }
              else {
                *(float *)local_2f8._8_8_ = fVar63;
                local_2f8._8_8_ = (float *)(local_2f8._8_8_ + 4);
              }
              lVar53 = lVar53 + 1;
              p_Var62 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
            } while (lVar53 < *(int *)(&this->field_0x108 + (long)p_Var62));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_a8,(vector<float,_std::allocator<float>_> *)local_2f8);
          convdw3x3s1_int8_dequant_sse
                    (&local_288,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var62),&local_a8,opt_00);
        }
        else {
          local_2f8._0_16_ = ZEXT816(0);
          local_2f8._16_8_ = 0;
          p_Var62 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
          if (0 < *(int *)(&this->field_0x108 + (long)p_Var62)) {
            lVar53 = 0;
            do {
              fVar63 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var62) + lVar53 * 4);
              fVar105 = 0.0;
              if (fVar63 != 0.0) {
                fVar105 = 1.0 / (fVar63 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var62) +
                                                    lVar53 * 4));
              }
              local_238.data = (void *)CONCAT44(local_238.data._4_4_,fVar105);
              local_1c8 = (pointer)CONCAT44(local_1c8._4_4_,
                                            *(undefined4 *)
                                             (*(long *)(&this->field_0x288 + (long)p_Var62) +
                                             lVar53 * 4));
              if (local_2f8._8_8_ == local_2f8._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_2f8,
                           (iterator)local_2f8._8_8_,(float *)&local_238);
              }
              else {
                *(float *)local_2f8._8_8_ = fVar105;
                local_2f8._8_8_ = (float *)(local_2f8._8_8_ + 4);
              }
              if (local_2f8._8_8_ == local_2f8._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_2f8,
                           (iterator)local_2f8._8_8_,(float *)&local_1c8);
              }
              else {
                *(float *)local_2f8._8_8_ = local_1c8._0_4_;
                local_2f8._8_8_ = (float *)(local_2f8._8_8_ + 4);
              }
              lVar53 = lVar53 + 1;
              p_Var62 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
            } while (lVar53 < *(int *)(&this->field_0x108 + (long)p_Var62));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_90,(vector<float,_std::allocator<float>_> *)local_2f8);
          convdw3x3s1_int8_requant_sse
                    (&local_288,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var62),&local_90,opt_00);
          local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
        if (local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ - local_2f8._0_8_);
        }
        pLVar7 = this->activation;
      }
      else {
        if ((((iVar66 != 3) || (*(int *)(&this->field_0xd8 + (long)p_Var62) != 3)) ||
            ((*(int *)(&this->field_0xdc + (long)p_Var62) != 1 ||
             (((*(int *)(&this->field_0xe0 + (long)p_Var62) != 1 ||
               (*(int *)(&this->field_0xe4 + (long)p_Var62) != 2)) ||
              (*(int *)(&this->field_0xe8 + (long)p_Var62) != 2)))))) ||
           (1 < *(uint *)(&this->field_0x110 + (long)p_Var62))) goto LAB_00442e53;
        if (iVar67 < 0x65) {
          local_2f8._0_16_ = ZEXT816(0);
          local_2f8._16_8_ = 0;
          p_Var62 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
          if (0 < *(int *)(&this->field_0x108 + (long)p_Var62)) {
            lVar53 = 0;
            do {
              fVar63 = 1.0 / (*(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var62) + lVar53 * 4)
                             * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var62) + lVar53 * 4
                                         ));
              local_238.data = (void *)CONCAT44(local_238.data._4_4_,fVar63);
              if (local_2f8._8_8_ == local_2f8._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_2f8,
                           (iterator)local_2f8._8_8_,(float *)&local_238);
              }
              else {
                *(float *)local_2f8._8_8_ = fVar63;
                local_2f8._8_8_ = (float *)(local_2f8._8_8_ + 4);
              }
              lVar53 = lVar53 + 1;
              p_Var62 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
            } while (lVar53 < *(int *)(&this->field_0x108 + (long)p_Var62));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_d8,(vector<float,_std::allocator<float>_> *)local_2f8);
          convdw3x3s2_int8_dequant_sse
                    (&local_288,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var62),&local_d8,opt_00);
        }
        else {
          local_2f8._0_16_ = ZEXT816(0);
          local_2f8._16_8_ = 0;
          p_Var62 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
          if (0 < *(int *)(&this->field_0x108 + (long)p_Var62)) {
            lVar53 = 0;
            do {
              fVar63 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var62) + lVar53 * 4);
              fVar105 = 0.0;
              if (fVar63 != 0.0) {
                fVar105 = 1.0 / (fVar63 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var62) +
                                                    lVar53 * 4));
              }
              local_238.data = (void *)CONCAT44(local_238.data._4_4_,fVar105);
              local_1c8 = (pointer)CONCAT44(local_1c8._4_4_,
                                            *(undefined4 *)
                                             (*(long *)(&this->field_0x288 + (long)p_Var62) +
                                             lVar53 * 4));
              if (local_2f8._8_8_ == local_2f8._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_2f8,
                           (iterator)local_2f8._8_8_,(float *)&local_238);
              }
              else {
                *(float *)local_2f8._8_8_ = fVar105;
                local_2f8._8_8_ = (float *)(local_2f8._8_8_ + 4);
              }
              if (local_2f8._8_8_ == local_2f8._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_2f8,
                           (iterator)local_2f8._8_8_,(float *)&local_1c8);
              }
              else {
                *(float *)local_2f8._8_8_ = local_1c8._0_4_;
                local_2f8._8_8_ = (float *)(local_2f8._8_8_ + 4);
              }
              lVar53 = lVar53 + 1;
              p_Var62 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
            } while (lVar53 < *(int *)(&this->field_0x108 + (long)p_Var62));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_c0,(vector<float,_std::allocator<float>_> *)local_2f8);
          convdw3x3s2_int8_requant_sse
                    (&local_288,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var62),&local_c0,opt_00);
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
        if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ - local_2f8._0_8_);
        }
        pLVar7 = this->activation;
      }
      if (pLVar7 != (Layer *)0x0) {
        (*pLVar7->_vptr_Layer[9])(pLVar7,top_blob,opt);
        iVar61 = 0;
        goto LAB_004434b3;
      }
    }
    else {
LAB_00442e53:
      local_298 = (long)*(int *)(&this->field_0xd8 + (long)p_Var62) * (long)iVar66;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_2f8,local_298,
                 (allocator_type *)&local_238);
      uVar43 = local_2f8._0_8_;
      pp_Var4 = this->_vptr_ConvolutionDepthWise_x86_avx512;
      p_Var62 = pp_Var4[-3];
      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var62)) {
        iVar66 = *(int *)(&this->field_0xe0 + (long)p_Var62);
        iVar60 = *(int *)(&this->field_0xdc + (long)p_Var62);
        iVar54 = *(int *)(&this->field_0xd4 + (long)p_Var62);
        iVar50 = 0;
        fVar63 = 0.0;
        iVar61 = 0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var4[-3])) {
            lVar53 = 0;
            do {
              *(float *)(local_2f8._0_8_ + (iVar61 + lVar53) * 4) = fVar63;
              fVar63 = (float)((int)fVar63 + *(int *)(&this->field_0xdc + (long)pp_Var4[-3]));
              lVar53 = lVar53 + 1;
            } while ((int)lVar53 < *(int *)(&this->field_0xd4 + (long)pp_Var4[-3]));
            iVar61 = iVar61 + (int)lVar53;
          }
          fVar63 = (float)((int)fVar63 + (iVar46 * iVar66 - iVar60 * iVar54));
          iVar50 = iVar50 + 1;
        } while (iVar50 < *(int *)(&this->field_0xd8 + (long)pp_Var4[-3]));
      }
      local_1d0 = this->_vptr_ConvolutionDepthWise_x86_avx512;
      if (0 < *(int *)(&this->field_0x108 + (long)local_1d0[-3])) {
        local_e0 = (long)(int)local_298;
        uVar58 = local_298 & 0xffffffff;
        local_1f0 = 0;
        auVar112 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
        lVar53 = 0;
        uVar57 = local_298;
        do {
          lVar47 = local_1f0;
          pvVar5 = local_288.data;
          if (-1 < (int)local_1d8) {
            lVar65 = local_288.cstep * lVar53;
            lVar42 = CONCAT44(local_288.elemsize._4_4_,(int)local_288.elemsize);
            local_2b0 = (float *)(top_blob->elemsize * lVar53 * top_blob->cstep +
                                 (long)top_blob->data);
            local_2a0 = (_func_int ***)this->_vptr_ConvolutionDepthWise_x86_avx512;
            uVar70 = local_288.w * lVar42;
            pvVar6 = (this->weight_data_tm).data;
            local_1e8 = 0;
            local_2a8 = local_2b0;
            local_290 = uVar70;
            do {
              if (-1 < iVar55) {
                local_1e0 = (ulong)(int)local_1e8;
                iVar66 = 0;
                do {
                  p_Var62 = (_func_int *)local_2a0[-3];
                  fVar63 = 0.0;
                  fVar105 = 0.0;
                  if (0 < (int)uVar57) {
                    uVar52 = 0;
                    iVar60 = 0;
                    do {
                      iVar60 = iVar60 + (int)*(char *)((long)pvVar6 + uVar52 + lVar47) *
                                        (int)*(char *)((long)(_func_int ***)pvVar5 +
                                                      (long)(int)*(pointer)(uVar43 + uVar52 * 4) +
                                                      (long)*(int *)(&this->field_0xe8 +
                                                                    (long)p_Var62) * local_1e0 *
                                                      uVar70 + (long)iVar66 *
                                                               (long)*(int *)(&this->field_0xe4 +
                                                                             (long)p_Var62) +
                                                               lVar65 * lVar42);
                      uVar52 = uVar52 + 1;
                    } while (uVar58 != uVar52);
                    auVar72 = vcvtsi2ss_avx512f(in_ZMM21._0_16_,iVar60);
                    fVar105 = auVar72._0_4_;
                  }
                  fVar147 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var62) + lVar53 * 4);
                  if (fVar147 != 0.0) {
                    fVar63 = 1.0 / (fVar147 *
                                   *(float *)(*(long *)(&this->field_0x240 + (long)p_Var62) +
                                             lVar53 * 4));
                  }
                  fVar63 = fVar63 * fVar105;
                  if (*(int *)(&this->field_0x100 + (long)p_Var62) != 0) {
                    fVar63 = fVar63 + *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var62) +
                                                lVar53 * 4);
                  }
                  auVar72 = ZEXT416((uint)fVar63);
                  fVar105 = fVar63;
                  switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var62)) {
                  case 1:
                    auVar72 = vmaxss_avx(auVar72,ZEXT416(0));
                    fVar105 = auVar72._0_4_;
                    break;
                  case 2:
                    uVar8 = vcmpss_avx512f(auVar72,ZEXT416(0),0xe);
                    bVar71 = (bool)((byte)uVar8 & 1);
                    fVar105 = (float)((uint)bVar71 * 0x3f800000 +
                                     (uint)!bVar71 * **(int **)(&this->field_0x118 + (long)p_Var62))
                              * fVar63;
                    break;
                  case 3:
                    fVar63 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var62))[1];
                    auVar72 = vmaxss_avx(auVar72,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                    (long)p_Var62)));
                    fVar105 = auVar72._0_4_;
                    if (fVar63 < auVar72._0_4_) {
                      fVar105 = fVar63;
                    }
                    break;
                  case 4:
                    auVar72 = vminss_avx(auVar72,SUB6416(ZEXT464(0x42b0c0a5),0));
                    uVar8 = vcmpss_avx512f(auVar72,ZEXT416(0xc2b0c0a5),1);
                    bVar71 = (bool)((byte)uVar8 & 1);
                    fVar63 = expf((float)((uint)bVar71 * 0x42b0c0a5 +
                                         (uint)!bVar71 * (auVar72._0_4_ ^ auVar112._0_4_)));
                    auVar112 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)
                                                 ));
                    uVar57 = local_298;
                    uVar70 = local_290;
                    fVar105 = 1.0 / (fVar63 + 1.0);
                    break;
                  case 5:
                    fVar105 = expf(fVar63);
                    fVar105 = logf(fVar105 + 1.0);
                    fVar105 = tanhf(fVar105);
                    auVar112 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)
                                                 ));
                    uVar57 = local_298;
                    uVar70 = local_290;
                    fVar105 = fVar105 * fVar63;
                    break;
                  case 6:
                    fVar147 = **(float **)(&this->field_0x118 + (long)p_Var62);
                    fVar2 = (*(float **)(&this->field_0x118 + (long)p_Var62))[1];
                    fVar113 = (float)((uint)fVar2 ^ auVar112._0_4_) / fVar147;
                    fVar105 = 0.0;
                    if ((fVar113 <= fVar63) && (fVar105 = fVar63, fVar63 <= fVar113 + 1.0 / fVar147)
                       ) {
                      auVar72 = vfmadd213ss_fma(ZEXT416((uint)fVar147),auVar72,ZEXT416((uint)fVar2))
                      ;
                      fVar105 = auVar72._0_4_ * fVar63;
                    }
                  }
                  if (iVar67 < 0x65) {
                    *local_2b0 = fVar105;
                    local_2b0 = local_2b0 + 1;
                  }
                  else {
                    fVar105 = fVar105 * *(float *)(*(long *)(&this->field_0x288 + (long)p_Var62) +
                                                  lVar53 * 4);
                    auVar72._8_4_ = 0x3effffff;
                    auVar72._0_8_ = 0x3effffff3effffff;
                    auVar72._12_4_ = 0x3effffff;
                    auVar72 = vpternlogd_avx512vl(auVar72,ZEXT416((uint)fVar105),auVar112._0_16_,
                                                  0xf8);
                    auVar72 = ZEXT416((uint)(fVar105 + auVar72._0_4_));
                    auVar72 = vroundss_avx(auVar72,auVar72,0xb);
                    iVar60 = (int)auVar72._0_4_;
                    if (iVar60 < -0x7e) {
                      iVar60 = -0x7f;
                    }
                    uVar48 = (undefined1)iVar60;
                    if (0x7e < iVar60) {
                      uVar48 = 0x7f;
                    }
                    *(undefined1 *)local_2a8 = uVar48;
                    local_2a8 = (float *)((long)local_2a8 + 1);
                  }
                  bVar71 = iVar66 != iVar55;
                  iVar66 = iVar66 + 1;
                } while (bVar71);
              }
              iVar66 = (int)local_1e8;
              local_1e8 = (ulong)(iVar66 + 1);
            } while (iVar66 != (int)local_1d8);
          }
          lVar53 = lVar53 + 1;
          local_1f0 = local_1f0 + local_e0;
        } while (lVar53 < *(int *)(&this->field_0x108 + (long)local_1d0[-3]));
      }
      if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ - local_2f8._0_8_);
      }
    }
    iVar61 = 0;
    goto LAB_004434b3;
  }
  iVar55 = *(int *)(&this->field_0x10c + (long)p_Var62);
  local_2a8 = (float *)0x1;
  if (opt->use_packing_layout == true) {
    if (iVar55 < 0x65) {
      local_2a8 = (float *)(ulong)((uint)((*(uint *)(&this->field_0xd0 + (long)p_Var62) & 3) == 0) *
                                   3 + 1);
    }
    else {
      local_2a8 = (float *)0x1;
      if ((*(uint *)(&this->field_0xd0 + (long)p_Var62) & 7) == 0) {
        local_2a8 = (float *)&DAT_00000008;
      }
    }
  }
  iVar67 = (int)local_2a8;
  pfVar56 = (float *)(ulong)(uint)(iVar67 * 4);
  if (100 < iVar55) {
    pfVar56 = local_2a8;
  }
  local_2a0 = (_func_int ***)CONCAT44(local_2a0._4_4_,iVar60);
  Mat::create(top_blob,iVar60,iVar66,*(int *)(&this->field_0xd0 + (long)p_Var62) / iVar67,
              (size_t)pfVar56,iVar67,opt->blob_allocator);
  OVar44 = _local_2f8;
  iVar61 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_004434b3;
  uVar59 = (int)uVar59 /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]);
  uVar49 = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]) /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]);
  local_2b0 = (float *)CONCAT44(local_2b0._4_4_,uVar49);
  iVar60 = 1;
  _elempack = 1;
  if (opt->use_packing_layout == true) {
    iVar60 = 1;
    if ((uVar59 & 7) == 0) {
      iVar60 = 8;
    }
    if (iVar55 < 0x65) {
      _elempack = (uint)((uVar49 & 3) == 0) * 3 + 1;
    }
    else {
      _elempack = 1;
      if ((uVar49 & 7) == 0) {
        _elempack = 8;
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_288.refcount._4_4_,(int)local_288.refcount);
  local_2f8._12_4_ = local_288.refcount._4_4_;
  local_2f8._8_4_ = (int)local_288.refcount;
  local_2f8._0_8_ = local_288.data;
  local_2f8._20_4_ = local_288.elemsize._4_4_;
  local_2f8._16_4_ = (int)local_288.elemsize;
  auStack_2dc = OVar44._28_36_;
  uStack_2e0 = local_288.elempack;
  pAStack_2d8 = local_288.allocator;
  uStack_2d0._4_1_ = (bool)(undefined1)local_288.w;
  uStack_2d0._5_1_ = (bool)local_288.w._1_1_;
  uStack_2d0._6_1_ = (bool)local_288.w._2_1_;
  uStack_2d0._7_1_ = (bool)local_288.w._3_1_;
  uStack_2d0._0_1_ = (bool)(undefined1)local_288.dims;
  uStack_2d0._1_1_ = (bool)local_288.dims._1_1_;
  uStack_2d0._2_1_ = (bool)local_288.dims._2_1_;
  uStack_2d0._3_1_ = (bool)local_288.dims._3_1_;
  uStack_2c8._4_1_ = (bool)(undefined1)local_288.d;
  uStack_2c8._5_1_ = (bool)local_288.d._1_1_;
  uStack_2c8._6_1_ = (bool)local_288.d._2_1_;
  uStack_2c8._7_1_ = (bool)local_288.d._3_1_;
  uStack_2c8._0_4_ = local_288.h;
  auStack_2dc._32_4_ = OVar44._60_4_;
  uStack_2c0._0_1_ = (bool)(undefined1)local_288.c;
  uStack_2c0._1_1_ = (bool)local_288.c._1_1_;
  uStack_2c0._2_1_ = (bool)local_288.c._2_1_;
  uStack_2c0._3_1_ = (bool)local_288.c._3_1_;
  local_2b8 = local_288.cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (iVar60 < iVar54) {
    local_238.data = *(void **)opt;
    uVar34 = opt->openmp_blocktime;
    uVar35 = opt->use_winograd_convolution;
    uVar37 = opt->use_sgemm_convolution;
    uVar39 = opt->use_int8_inference;
    uVar41 = opt->use_vulkan_compute;
    uVar40 = CONCAT11(uVar41,uVar39);
    uVar38 = CONCAT21(uVar40,uVar37);
    uVar36 = CONCAT31(uVar38,uVar35);
    local_238.allocator = *(Allocator **)&opt->use_bf16_storage;
    local_238._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    local_238._48_8_ = *(undefined8 *)&opt->flush_denormals;
    local_238.c._0_1_ = opt->use_winograd43_convolution;
    local_238.c._1_1_ = opt->use_winograd63_convolution;
    local_238.c._2_1_ = opt->use_reserved_6;
    local_238.c._3_1_ = opt->use_reserved_7;
    local_238._60_1_ = opt->use_reserved_8;
    local_238._61_1_ = opt->use_reserved_9;
    local_238._62_1_ = opt->use_reserved_10;
    local_238._63_1_ = opt->use_reserved_11;
    local_238.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    local_238.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_238.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    local_238.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_238.elempack = uVar34;
    local_238._28_4_ = uVar36;
    convert_packing(&local_288,(Mat *)local_2f8,iVar60,(Option *)&local_238);
  }
  piVar3 = top_blob->refcount;
  local_238.data = top_blob->data;
  local_238.refcount._0_4_ = SUB84(top_blob->refcount,0);
  local_238.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
  local_238.elemsize._0_4_ = (undefined4)top_blob->elemsize;
  local_238.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
  local_238.elempack = top_blob->elempack;
  local_238.allocator = top_blob->allocator;
  local_238.dims = top_blob->dims;
  local_238.w = top_blob->w;
  local_238.h = top_blob->h;
  local_238.d = top_blob->d;
  local_238.c = top_blob->c;
  local_238.cstep = top_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (_elempack < (uint)local_2a8) {
    Mat::create(&local_238,(int)local_2a0,iVar66,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3])
                / (int)_elempack,
                (ulong)((int)((ulong)pfVar56 / ((ulong)local_2a8 & 0xffffffff)) * _elempack),
                _elempack,opt->workspace_allocator);
    iVar61 = -100;
    if ((local_238.data != (void *)0x0) && ((long)local_238.c * local_238.cstep != 0))
    goto LAB_004428ee;
  }
  else {
LAB_004428ee:
    if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3])) {
      local_2a0 = (_func_int ***)CONCAT44(local_2a0._4_4_,(int)uVar59 / iVar60);
      iVar66 = (int)local_2b0 / (int)_elempack;
      iVar67 = 0;
      iVar55 = 0;
      lVar53 = 0;
      do {
        OVar44 = _local_2f8;
        local_1c8 = (pointer)((long)(iVar67 / iVar60) * local_2b8 * local_2f8._16_8_ +
                             local_2f8._0_8_);
        uStack_1c0 = 0;
        uStack_1bc = 0;
        local_1b8 = local_2f8._16_4_;
        uStack_1b4 = local_2f8._20_4_;
        local_1b0 = uStack_2e0;
        local_1a8 = pAStack_2d8;
        local_190 = (int)local_2a0;
        uVar43 = uStack_2d0;
        uVar8 = uStack_2c8;
        local_188 = ((long)uStack_2c8._4_4_ * local_2f8._16_8_ *
                     (long)(int)uStack_2c8 * (long)uStack_2d0._4_4_ + 0xfU & 0xfffffffffffffff0) /
                    (ulong)local_2f8._16_8_;
        uStack_2d0._0_4_ = (int)uVar43;
        uStack_2d0._4_4_ = SUB84(uVar43,4);
        local_1a0._0_4_ = (int)uStack_2d0;
        local_1a0._4_4_ = uStack_2d0._4_4_;
        uStack_2c8._0_4_ = (int)uVar8;
        uStack_2c8._4_4_ = SUB84(uVar8,4);
        uStack_198._0_4_ = (int)uStack_2c8;
        uStack_198._4_4_ = uStack_2c8._4_4_;
        local_138 = CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
        local_178 = (void *)((long)(iVar55 / (int)_elempack) * local_238.cstep * local_138 +
                            (long)local_238.data);
        uStack_170 = 0;
        uStack_16c = 0;
        local_168 = (undefined4)local_238.elemsize;
        uStack_164 = local_238.elemsize._4_4_;
        local_160 = local_238.elempack;
        local_158 = local_238.allocator;
        local_138 = ((long)local_238.d * local_138 * (long)local_238.h * (long)local_238.w + 0xf &
                    0xfffffffffffffff0) / local_138;
        local_150._0_4_ = local_238.dims;
        local_150._4_4_ = local_238.w;
        uStack_148._0_4_ = local_238.h;
        uStack_148._4_4_ = local_238.d;
        pLVar7 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar53];
        local_78._0_1_ = opt->lightmode;
        local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
        local_78._4_4_ = opt->num_threads;
        pAStack_68 = opt->workspace_allocator;
        uStack_60._0_4_ = opt->openmp_blocktime;
        uStack_60._4_1_ = opt->use_winograd_convolution;
        uStack_60._5_1_ = opt->use_sgemm_convolution;
        uStack_60._6_1_ = opt->use_int8_inference;
        uStack_60._7_1_ = opt->use_vulkan_compute;
        uStack_58._0_1_ = opt->use_bf16_storage;
        uStack_58._1_1_ = opt->use_fp16_packed;
        uStack_58._2_1_ = opt->use_fp16_storage;
        uStack_58._3_1_ = opt->use_fp16_arithmetic;
        uStack_58._4_1_ = opt->use_int8_packed;
        uStack_58._5_1_ = opt->use_int8_storage;
        uStack_58._6_1_ = opt->use_int8_arithmetic;
        uStack_58._7_1_ = opt->use_packing_layout;
        uStack_50._0_1_ = opt->use_shader_pack8;
        uStack_50._1_1_ = opt->use_subgroup_basic;
        uStack_50._2_1_ = opt->use_subgroup_vote;
        uStack_50._3_1_ = opt->use_subgroup_ballot;
        uStack_50._4_1_ = opt->use_subgroup_shuffle;
        uStack_50._5_1_ = opt->use_image_storage;
        uStack_50._6_1_ = opt->use_tensor_storage;
        uStack_50._7_1_ = opt->use_reserved_0;
        uStack_48._0_4_ = opt->flush_denormals;
        uStack_48._4_1_ = opt->use_local_pool_allocator;
        uStack_48._5_1_ = opt->use_shader_local_memory;
        uStack_48._6_1_ = opt->use_cooperative_matrix;
        uStack_48._7_1_ = opt->use_winograd23_convolution;
        uStack_40._0_1_ = opt->use_winograd43_convolution;
        uStack_40._1_1_ = opt->use_winograd63_convolution;
        uStack_40._2_1_ = opt->use_reserved_6;
        uStack_40._3_1_ = opt->use_reserved_7;
        uStack_40._4_1_ = opt->use_reserved_8;
        uStack_40._5_1_ = opt->use_reserved_9;
        uStack_40._6_1_ = opt->use_reserved_10;
        uStack_40._7_1_ = opt->use_reserved_11;
        pAStack_70 = local_238.allocator;
        _local_2f8 = OVar44;
        local_140 = iVar66;
        (*pLVar7->_vptr_Layer[7])(pLVar7,&local_1c8,&local_178);
        piVar3 = (int *)CONCAT44(uStack_16c,uStack_170);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_158 == (Allocator *)0x0) {
              if (local_178 != (void *)0x0) {
                free(local_178);
              }
            }
            else {
              (*local_158->_vptr_Allocator[3])();
            }
          }
        }
        local_138 = 0;
        local_178 = (void *)0x0;
        uStack_170 = 0;
        uStack_16c = 0;
        local_168 = 0;
        uStack_164 = 0;
        local_160 = 0;
        local_150 = 0;
        uStack_148 = 0;
        local_140 = 0;
        piVar3 = (int *)CONCAT44(uStack_1bc,uStack_1c0);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_1a8 == (Allocator *)0x0) {
              if (local_1c8 != (pointer)0x0) {
                free(local_1c8);
              }
            }
            else {
              (*local_1a8->_vptr_Allocator[3])();
            }
          }
        }
        local_188 = 0;
        local_1c8 = (pointer)0x0;
        uStack_1c0 = 0;
        uStack_1bc = 0;
        local_1b8 = 0;
        uStack_1b4 = 0;
        local_1b0 = 0;
        local_1a0 = 0;
        uStack_198 = 0;
        local_190 = 0;
        lVar53 = lVar53 + 1;
        iVar55 = iVar55 + (int)local_2b0;
        iVar67 = iVar67 + uVar59;
      } while (lVar53 < *(int *)(&this->field_0x108 +
                                (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
    }
    if (_elempack < (uint)local_2a8) {
      convert_packing(&local_238,top_blob,(uint)local_2a8,opt);
      iVar61 = 0;
    }
    else {
      iVar61 = 0;
      if (&local_238 != top_blob) {
        piVar3 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        iVar61 = 0;
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_238.data;
        top_blob->refcount = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
        top_blob->elemsize = CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
        top_blob->elempack = local_238.elempack;
        top_blob->allocator = local_238.allocator;
        top_blob->dims = local_238.dims;
        top_blob->w = local_238.w;
        top_blob->h = local_238.h;
        top_blob->d = local_238.d;
        top_blob->c = local_238.c;
        top_blob->cstep = local_238.cstep;
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_238.allocator == (Allocator *)0x0) {
        if (local_238.data != (void *)0x0) {
          free(local_238.data);
        }
      }
      else {
        (*(local_238.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_238.cstep = 0;
  local_238.data = (void *)0x0;
  local_238.refcount._0_4_ = 0;
  local_238.refcount._4_4_ = 0;
  local_238.elemsize._0_4_ = 0;
  local_238.elemsize._4_4_ = 0;
  local_238.elempack = 0;
  local_238.dims = 0;
  local_238.w = 0;
  local_238.h = 0;
  local_238.d = 0;
  local_238._56_8_ = local_238._56_8_ & 0xffffffff00000000;
  if ((Allocator *)local_2f8._8_8_ != (Allocator *)0x0) {
    LOCK();
    *(int *)(_func_int ***)local_2f8._8_8_ = *(int *)(_func_int ***)local_2f8._8_8_ + -1;
    UNLOCK();
    if (*(int *)(_func_int ***)local_2f8._8_8_ == 0) {
      if (pAStack_2d8 == (Allocator *)0x0) {
        if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
          free((void *)local_2f8._0_8_);
        }
      }
      else {
        (*pAStack_2d8->_vptr_Allocator[3])();
      }
    }
  }
  auVar45 = auStack_2dc;
  local_2b8 = 0;
  local_2f8._0_16_ = ZEXT816(0);
  _local_2f8 = ZEXT1228(local_2f8._0_12_);
  auStack_2dc._32_4_ = auVar45._32_4_;
  _local_2f8 = ZEXT4060(_local_2f8);
LAB_004434b3:
  piVar3 = (int *)CONCAT44(local_288.refcount._4_4_,(int)local_288.refcount);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_288.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_288.data != (Allocator *)0x0) {
          free(local_288.data);
        }
      }
      else {
        (*(local_288.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_288.cstep = 0;
  local_288.data = (void *)0x0;
  local_288.refcount._0_4_ = 0;
  local_288.refcount._4_4_ = 0;
  local_288.elemsize._0_4_ = 0;
  local_288.elemsize._4_4_ = 0;
  local_288.elempack = 0;
  local_288.dims = 0;
  local_288.w = 0;
  local_288.h = 0;
  local_288.d = 0;
  local_288.c = 0;
  piVar3 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_128.allocator == (Allocator *)0x0) {
        if (local_128.data != (void *)0x0) {
          free(local_128.data);
        }
      }
      else {
        (*(local_128.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar61;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}